

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QObject_*>::growAppend
          (QCommonArrayOps<QObject_*> *this,QObject **b,QObject **e)

{
  long n;
  QObject **ppQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QObject_*> local_48;
  QObject **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 3;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QObject **)0x0;
    ppQVar1 = (this->super_Type).super_QArrayDataPointer<QObject_*>.ptr;
    if ((b < ppQVar1) || (ppQVar1 + (this->super_Type).super_QArrayDataPointer<QObject_*>.size <= b)
       ) {
      QArrayDataPointer<QObject_*>::detachAndGrow
                ((QArrayDataPointer<QObject_*> *)this,GrowsAtEnd,n,(QObject ***)0x0,
                 (QArrayDataPointer<QObject_*> *)0x0);
      ppQVar1 = b;
    }
    else {
      QArrayDataPointer<QObject_*>::detachAndGrow
                ((QArrayDataPointer<QObject_*> *)this,GrowsAtEnd,n,&local_28,&local_48);
      ppQVar1 = local_28;
    }
    QPodArrayOps<QObject_*>::copyAppend
              (&this->super_Type,ppQVar1,(QObject **)(((long)e - (long)b) + (long)ppQVar1));
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }